

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphFileOperations.hpp
# Opt level: O3

string * floorplan::GraphFileOperations::formatStringForDot
                   (string *__return_storage_ptr__,string *str)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  undefined8 uVar3;
  long lVar4;
  ulong uVar5;
  string illegalChars;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  if (str->_M_string_length != 0) {
    if ((int)*(str->_M_dataplus)._M_p - 0x30U < 10) {
      std::operator+(&local_40,"S",str);
      std::__cxx11::string::operator=((string *)str,(string *)&local_40);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_40._M_dataplus._M_p != &local_40.field_2) {
        operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
      }
    }
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"-* ","");
    uVar5 = 0;
    while( true ) {
      lVar4 = std::__cxx11::string::find_first_of
                        ((char *)str,(ulong)local_40._M_dataplus._M_p,uVar5);
      if (lVar4 == -1) break;
      (str->_M_dataplus)._M_p[lVar4] = '_';
      uVar5 = lVar4 + 1;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar2 = (str->_M_dataplus)._M_p;
  paVar1 = &str->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 == paVar1) {
    uVar3 = *(undefined8 *)((long)&str->field_2 + 8);
    (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar3;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = pcVar2;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  __return_storage_ptr__->_M_string_length = str->_M_string_length;
  (str->_M_dataplus)._M_p = (pointer)paVar1;
  str->_M_string_length = 0;
  (str->field_2)._M_local_buf[0] = '\0';
  return __return_storage_ptr__;
}

Assistant:

static string formatStringForDot(string str){
        if (str.size() != 0){
            if (isdigit(str[0]))
                str = "S" + str;

            string illegalChars = "-* ";
            size_t found=str.find_first_of(illegalChars);
            while (found!=string::npos)
            {
                str[found]='_';
                found=str.find_first_of(illegalChars,found+1);
            }
        }
        return str;

    }